

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode Curl_ssl_peer_init(ssl_peer *peer,Curl_cfilter *cf,int transport)

{
  connectdata *pcVar1;
  char *__s1;
  proxy_info *ppVar2;
  proxy_info *ppVar3;
  int iVar4;
  char *__cp;
  char *pcVar5;
  size_t sVar6;
  int *piVar7;
  ssl_peer_type sVar8;
  size_t n;
  CURLcode CVar9;
  undefined1 local_40 [16];
  
  peer->transport = transport;
  pcVar1 = cf->conn;
  ppVar2 = &pcVar1->http_proxy;
  ppVar3 = &pcVar1->http_proxy;
  piVar7 = &(pcVar1->http_proxy).port;
  if ((~cf->cft->flags & 10U) != 0) {
    piVar7 = &pcVar1->remote_port;
    ppVar2 = (proxy_info *)&pcVar1->host;
    ppVar3 = (proxy_info *)&pcVar1->host;
  }
  pcVar5 = (ppVar3->host).dispname;
  __s1 = (ppVar2->host).name;
  peer->port = *piVar7;
  CVar9 = CURLE_FAILED_INIT;
  if ((__s1 != (char *)0x0) && (*__s1 != '\0')) {
    __cp = (*Curl_cstrdup)(__s1);
    peer->hostname = __cp;
    CVar9 = CURLE_OUT_OF_MEMORY;
    if (__cp != (char *)0x0) {
      if ((pcVar5 == (char *)0x0) || (iVar4 = strcmp(__s1,pcVar5), iVar4 == 0)) {
        peer->dispname = __cp;
      }
      else {
        pcVar5 = (*Curl_cstrdup)(pcVar5);
        peer->dispname = pcVar5;
        if (pcVar5 == (char *)0x0) goto LAB_0016ac6b;
        __cp = peer->hostname;
      }
      if (*__cp != '\0') {
        sVar8 = CURL_SSL_PEER_IPV6;
        iVar4 = inet_pton(2,__cp,local_40);
        if (iVar4 != 0) {
          sVar8 = CURL_SSL_PEER_IPV4;
LAB_0016abfa:
          peer->type = sVar8;
          return CURLE_OK;
        }
        iVar4 = inet_pton(10,__cp,local_40);
        if (iVar4 != 0) goto LAB_0016abfa;
        __cp = peer->hostname;
      }
      peer->type = CURL_SSL_PEER_DNS;
      sVar6 = strlen(__cp);
      if (sVar6 == 0) {
        n = 0;
      }
      else {
        n = sVar6 - (__cp[sVar6 - 1] == '.');
        if (0xfffe < n) {
          return CURLE_OK;
        }
      }
      pcVar5 = (char *)(*Curl_ccalloc)(1,n + 1);
      peer->sni = pcVar5;
      if (pcVar5 != (char *)0x0) {
        Curl_strntolower(pcVar5,peer->hostname,n);
        peer->sni[n] = '\0';
        return CURLE_OK;
      }
    }
  }
LAB_0016ac6b:
  Curl_ssl_peer_cleanup(peer);
  return CVar9;
}

Assistant:

CURLcode Curl_ssl_peer_init(struct ssl_peer *peer, struct Curl_cfilter *cf,
                            int transport)
{
  const char *ehostname, *edispname;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  /* We expect a clean struct, e.g. called only ONCE */
  DEBUGASSERT(peer);
  DEBUGASSERT(!peer->hostname);
  DEBUGASSERT(!peer->dispname);
  DEBUGASSERT(!peer->sni);
  /* We need the hostname for SNI negotiation. Once handshaked, this remains
   * the SNI hostname for the TLS connection. When the connection is reused,
   * the settings in cf->conn might change. We keep a copy of the hostname we
   * use for SNI.
   */
  peer->transport = transport;
#ifndef CURL_DISABLE_PROXY
  if(Curl_ssl_cf_is_proxy(cf)) {
    ehostname = cf->conn->http_proxy.host.name;
    edispname = cf->conn->http_proxy.host.dispname;
    peer->port = cf->conn->http_proxy.port;
  }
  else
#endif
  {
    ehostname = cf->conn->host.name;
    edispname = cf->conn->host.dispname;
    peer->port = cf->conn->remote_port;
  }

  /* hostname MUST exist and not be empty */
  if(!ehostname || !ehostname[0]) {
    result = CURLE_FAILED_INIT;
    goto out;
  }

  peer->hostname = strdup(ehostname);
  if(!peer->hostname)
    goto out;
  if(!edispname || !strcmp(ehostname, edispname))
    peer->dispname = peer->hostname;
  else {
    peer->dispname = strdup(edispname);
    if(!peer->dispname)
      goto out;
  }
  peer->type = get_peer_type(peer->hostname);
  if(peer->type == CURL_SSL_PEER_DNS) {
    /* not an IP address, normalize according to RCC 6066 ch. 3,
     * max len of SNI is 2^16-1, no trailing dot */
    size_t len = strlen(peer->hostname);
    if(len && (peer->hostname[len-1] == '.'))
      len--;
    if(len < USHRT_MAX) {
      peer->sni = calloc(1, len + 1);
      if(!peer->sni)
        goto out;
      Curl_strntolower(peer->sni, peer->hostname, len);
      peer->sni[len] = 0;
    }
  }
  result = CURLE_OK;

out:
  if(result)
    Curl_ssl_peer_cleanup(peer);
  return result;
}